

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_dense.cpp
# Opt level: O0

void __thiscall
test_matrix_dense_scalar_matrix_multiplication_assignment_Test::TestBody
          (test_matrix_dense_scalar_matrix_multiplication_assignment_Test *this)

{
  double dVar1;
  bool bVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  reference pvVar4;
  array<double,_3UL> *paVar5;
  reference pvVar6;
  char *pcVar7;
  Vector_Dense<double,_0UL> *local_4b0;
  AssertHelper local_4a8;
  Message local_4a0;
  undefined1 local_498 [8];
  AssertionResult gtest_ar_17;
  Message local_480;
  undefined1 local_478 [8];
  AssertionResult gtest_ar_16;
  Message local_460;
  undefined1 local_458 [8];
  AssertionResult gtest_ar_15;
  Message local_440;
  undefined1 local_438 [8];
  AssertionResult gtest_ar_14;
  Message local_420;
  undefined1 local_418 [8];
  AssertionResult gtest_ar_13;
  Message local_400;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar_12;
  Message local_3e0;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_11;
  Message local_3c0;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_10;
  Message local_3a0;
  undefined1 local_398 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_380;
  Message local_378;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_8;
  Message local_358;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_7;
  Message local_338;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_6;
  Message local_318;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_5;
  Message local_2f8;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_4;
  Message local_2d8;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_3;
  Message local_2b8;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_2;
  Message local_298;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_1;
  Message local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar;
  double local_258 [4];
  initializer_list<double> local_238;
  double local_228 [4];
  initializer_list<double> local_208;
  double local_1f8 [4];
  initializer_list<double> local_1d8;
  Vector_Dense<double,_3UL> local_1c8;
  Vector_Dense<double,_3UL> local_1b0;
  Vector_Dense<double,_3UL> local_198;
  initializer_list<Disa::Vector_Dense<double,_3UL>_> local_180;
  undefined1 local_170 [8];
  Matrix_Dense<double,_3UL,_3UL> static_matrix;
  initializer_list<double> local_108;
  double local_f8 [4];
  initializer_list<double> local_d8 [2];
  double local_b8 [4];
  initializer_list<double> local_98;
  Vector_Dense<double,_0UL> *local_88;
  Vector_Dense<double,_0UL> local_80;
  Vector_Dense<double,_0UL> local_68;
  Vector_Dense<double,_0UL> local_50;
  undefined1 local_38 [24];
  Matrix_Dense<double,_0UL,_0UL> dynamic_matrix;
  test_matrix_dense_scalar_matrix_multiplication_assignment_Test *this_local;
  
  local_88 = &local_80;
  local_b8[2] = 3.0;
  local_b8[0] = 1.0;
  local_b8[1] = 2.0;
  local_98._M_array = local_b8;
  local_98._M_len = 3;
  dynamic_matrix.
  super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(local_88,&local_98);
  local_88 = &local_68;
  local_f8[2] = 6.0;
  local_f8[0] = 4.0;
  local_f8[1] = 5.0;
  local_d8[0]._M_array = local_f8;
  local_d8[0]._M_len = 3;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(local_88,local_d8);
  local_88 = &local_50;
  static_matrix.super_array<Disa::Vector_Dense<double,_3UL>,_3UL>._M_elems[2].
  super_array<double,_3UL>._M_elems[2] = 7.0;
  local_108._M_array =
       static_matrix.super_array<Disa::Vector_Dense<double,_3UL>,_3UL>._M_elems[2].
       super_array<double,_3UL>._M_elems + 2;
  local_108._M_len = 3;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(local_88,&local_108);
  local_38._0_8_ = &local_80;
  local_38._8_8_ = (pointer)0x3;
  Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
            ((Matrix_Dense<double,_0UL,_0UL> *)(local_38 + 0x10),
             (initializer_list<Disa::Vector_Dense<double,_0UL>_> *)local_38);
  local_4b0 = (Vector_Dense<double,_0UL> *)local_38;
  do {
    local_4b0 = local_4b0 + -1;
    Disa::Vector_Dense<double,_0UL>::~Vector_Dense(local_4b0);
  } while (local_4b0 != &local_80);
  local_1f8[0] = 10.0;
  local_1f8[1] = 20.0;
  local_1f8[2] = 30.0;
  local_1d8._M_array = local_1f8;
  local_1d8._M_len = 3;
  Disa::Vector_Dense<double,_3UL>::Vector_Dense(&local_1c8,&local_1d8);
  local_228[0] = 40.0;
  local_228[1] = 50.0;
  local_228[2] = 60.0;
  local_208._M_array = local_228;
  local_208._M_len = 3;
  Disa::Vector_Dense<double,_3UL>::Vector_Dense(&local_1b0,&local_208);
  local_258[0] = 70.0;
  local_258[1] = 80.0;
  local_258[2] = 90.0;
  local_238._M_array = local_258;
  local_238._M_len = 3;
  Disa::Vector_Dense<double,_3UL>::Vector_Dense(&local_198,&local_238);
  local_180._M_array = &local_1c8;
  local_180._M_len = 3;
  Disa::Matrix_Dense<double,_3UL,_3UL>::Matrix_Dense
            ((Matrix_Dense<double,_3UL,_3UL> *)local_170,&local_180);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0xc024000000000000;
  Disa::Matrix_Dense<double,_0UL,_0UL>::operator*=
            ((Matrix_Dense<double,_0UL,_0UL> *)(local_38 + 0x10),(Scalar *)&gtest_ar.message_);
  pvVar3 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)(local_38 + 0x10),0)->super_vector<double,_std::allocator<double>_>;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,0);
  dVar1 = *pvVar4;
  paVar5 = &std::array<Disa::Vector_Dense<double,_3UL>,_3UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_3UL>,_3UL> *)local_170,0)->
            super_array<double,_3UL>;
  pvVar6 = std::array<double,_3UL>::operator[](paVar5,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_270,"dynamic_matrix[0][0]","-1.0 * static_matrix[0][0]",dVar1,
             -*pvVar6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar2) {
    testing::Message::Message(&local_278);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x7a,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  pvVar3 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)(local_38 + 0x10),0)->super_vector<double,_std::allocator<double>_>;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,1);
  dVar1 = *pvVar4;
  paVar5 = &std::array<Disa::Vector_Dense<double,_3UL>,_3UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_3UL>,_3UL> *)local_170,0)->
            super_array<double,_3UL>;
  pvVar6 = std::array<double,_3UL>::operator[](paVar5,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_290,"dynamic_matrix[0][1]","-1.0 * static_matrix[0][1]",dVar1,
             -*pvVar6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar2) {
    testing::Message::Message(&local_298);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x7b,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  pvVar3 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)(local_38 + 0x10),0)->super_vector<double,_std::allocator<double>_>;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,2);
  dVar1 = *pvVar4;
  paVar5 = &std::array<Disa::Vector_Dense<double,_3UL>,_3UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_3UL>,_3UL> *)local_170,0)->
            super_array<double,_3UL>;
  pvVar6 = std::array<double,_3UL>::operator[](paVar5,2);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2b0,"dynamic_matrix[0][2]","-1.0 * static_matrix[0][2]",dVar1,
             -*pvVar6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar2) {
    testing::Message::Message(&local_2b8);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x7c,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  pvVar3 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)(local_38 + 0x10),1)->super_vector<double,_std::allocator<double>_>;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,0);
  dVar1 = *pvVar4;
  paVar5 = &std::array<Disa::Vector_Dense<double,_3UL>,_3UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_3UL>,_3UL> *)local_170,1)->
            super_array<double,_3UL>;
  pvVar6 = std::array<double,_3UL>::operator[](paVar5,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2d0,"dynamic_matrix[1][0]","-1.0 * static_matrix[1][0]",dVar1,
             -*pvVar6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar2) {
    testing::Message::Message(&local_2d8);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x7d,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  pvVar3 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)(local_38 + 0x10),1)->super_vector<double,_std::allocator<double>_>;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,1);
  dVar1 = *pvVar4;
  paVar5 = &std::array<Disa::Vector_Dense<double,_3UL>,_3UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_3UL>,_3UL> *)local_170,1)->
            super_array<double,_3UL>;
  pvVar6 = std::array<double,_3UL>::operator[](paVar5,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2f0,"dynamic_matrix[1][1]","-1.0 * static_matrix[1][1]",dVar1,
             -*pvVar6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar2) {
    testing::Message::Message(&local_2f8);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x7e,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  pvVar3 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)(local_38 + 0x10),1)->super_vector<double,_std::allocator<double>_>;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,2);
  dVar1 = *pvVar4;
  paVar5 = &std::array<Disa::Vector_Dense<double,_3UL>,_3UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_3UL>,_3UL> *)local_170,1)->
            super_array<double,_3UL>;
  pvVar6 = std::array<double,_3UL>::operator[](paVar5,2);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_310,"dynamic_matrix[1][2]","-1.0 * static_matrix[1][2]",dVar1,
             -*pvVar6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar2) {
    testing::Message::Message(&local_318);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x7f,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  pvVar3 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)(local_38 + 0x10),2)->super_vector<double,_std::allocator<double>_>;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,0);
  dVar1 = *pvVar4;
  paVar5 = &std::array<Disa::Vector_Dense<double,_3UL>,_3UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_3UL>,_3UL> *)local_170,2)->
            super_array<double,_3UL>;
  pvVar6 = std::array<double,_3UL>::operator[](paVar5,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_330,"dynamic_matrix[2][0]","-1.0 * static_matrix[2][0]",dVar1,
             -*pvVar6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar2) {
    testing::Message::Message(&local_338);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x80,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  pvVar3 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)(local_38 + 0x10),2)->super_vector<double,_std::allocator<double>_>;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,1);
  dVar1 = *pvVar4;
  paVar5 = &std::array<Disa::Vector_Dense<double,_3UL>,_3UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_3UL>,_3UL> *)local_170,2)->
            super_array<double,_3UL>;
  pvVar6 = std::array<double,_3UL>::operator[](paVar5,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_350,"dynamic_matrix[2][1]","-1.0 * static_matrix[2][1]",dVar1,
             -*pvVar6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar2) {
    testing::Message::Message(&local_358);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x81,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  pvVar3 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)(local_38 + 0x10),2)->super_vector<double,_std::allocator<double>_>;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,2);
  dVar1 = *pvVar4;
  paVar5 = &std::array<Disa::Vector_Dense<double,_3UL>,_3UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_3UL>,_3UL> *)local_170,2)->
            super_array<double,_3UL>;
  pvVar6 = std::array<double,_3UL>::operator[](paVar5,2);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_370,"dynamic_matrix[2][2]","-1.0 * static_matrix[2][2]",dVar1,
             -*pvVar6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar2) {
    testing::Message::Message(&local_378);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x82,pcVar7);
    testing::internal::AssertHelper::operator=(&local_380,&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    testing::Message::~Message(&local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  gtest_ar_9.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x3fb999999999999a;
  Disa::Matrix_Dense<double,_3UL,_3UL>::operator*=
            ((Matrix_Dense<double,_3UL,_3UL> *)local_170,(Scalar *)&gtest_ar_9.message_);
  pvVar3 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)(local_38 + 0x10),0)->super_vector<double,_std::allocator<double>_>;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,0);
  dVar1 = *pvVar4;
  paVar5 = &std::array<Disa::Vector_Dense<double,_3UL>,_3UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_3UL>,_3UL> *)local_170,0)->
            super_array<double,_3UL>;
  pvVar6 = std::array<double,_3UL>::operator[](paVar5,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_398,"-0.1 * dynamic_matrix[0][0]","static_matrix[0][0]",dVar1 * -0.1,
             *pvVar6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
  if (!bVar2) {
    testing::Message::Message(&local_3a0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_398);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x85,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
  pvVar3 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)(local_38 + 0x10),0)->super_vector<double,_std::allocator<double>_>;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,1);
  dVar1 = *pvVar4;
  paVar5 = &std::array<Disa::Vector_Dense<double,_3UL>,_3UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_3UL>,_3UL> *)local_170,0)->
            super_array<double,_3UL>;
  pvVar6 = std::array<double,_3UL>::operator[](paVar5,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_3b8,"-0.1 * dynamic_matrix[0][1]","static_matrix[0][1]",dVar1 * -0.1,
             *pvVar6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
  if (!bVar2) {
    testing::Message::Message(&local_3c0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x86,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_3c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
  pvVar3 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)(local_38 + 0x10),0)->super_vector<double,_std::allocator<double>_>;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,2);
  dVar1 = *pvVar4;
  paVar5 = &std::array<Disa::Vector_Dense<double,_3UL>,_3UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_3UL>,_3UL> *)local_170,0)->
            super_array<double,_3UL>;
  pvVar6 = std::array<double,_3UL>::operator[](paVar5,2);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_3d8,"-0.1 * dynamic_matrix[0][2]","static_matrix[0][2]",dVar1 * -0.1,
             *pvVar6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar2) {
    testing::Message::Message(&local_3e0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x87,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_3e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  pvVar3 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)(local_38 + 0x10),1)->super_vector<double,_std::allocator<double>_>;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,0);
  dVar1 = *pvVar4;
  paVar5 = &std::array<Disa::Vector_Dense<double,_3UL>,_3UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_3UL>,_3UL> *)local_170,1)->
            super_array<double,_3UL>;
  pvVar6 = std::array<double,_3UL>::operator[](paVar5,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_3f8,"-0.1 * dynamic_matrix[1][0]","static_matrix[1][0]",dVar1 * -0.1,
             *pvVar6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
  if (!bVar2) {
    testing::Message::Message(&local_400);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_3f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x88,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_400);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
  pvVar3 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)(local_38 + 0x10),1)->super_vector<double,_std::allocator<double>_>;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,1);
  dVar1 = *pvVar4;
  paVar5 = &std::array<Disa::Vector_Dense<double,_3UL>,_3UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_3UL>,_3UL> *)local_170,1)->
            super_array<double,_3UL>;
  pvVar6 = std::array<double,_3UL>::operator[](paVar5,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_418,"-0.1 * dynamic_matrix[1][1]","static_matrix[1][1]",dVar1 * -0.1,
             *pvVar6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar2) {
    testing::Message::Message(&local_420);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_418);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x89,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_420);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_420);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  pvVar3 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)(local_38 + 0x10),1)->super_vector<double,_std::allocator<double>_>;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,2);
  dVar1 = *pvVar4;
  paVar5 = &std::array<Disa::Vector_Dense<double,_3UL>,_3UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_3UL>,_3UL> *)local_170,1)->
            super_array<double,_3UL>;
  pvVar6 = std::array<double,_3UL>::operator[](paVar5,2);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_438,"-0.1 * dynamic_matrix[1][2]","static_matrix[1][2]",dVar1 * -0.1,
             *pvVar6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
  if (!bVar2) {
    testing::Message::Message(&local_440);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_438);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x8a,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_440);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
  pvVar3 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)(local_38 + 0x10),2)->super_vector<double,_std::allocator<double>_>;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,0);
  dVar1 = *pvVar4;
  paVar5 = &std::array<Disa::Vector_Dense<double,_3UL>,_3UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_3UL>,_3UL> *)local_170,2)->
            super_array<double,_3UL>;
  pvVar6 = std::array<double,_3UL>::operator[](paVar5,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_458,"-0.1 * dynamic_matrix[2][0]","static_matrix[2][0]",dVar1 * -0.1,
             *pvVar6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
  if (!bVar2) {
    testing::Message::Message(&local_460);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x8b,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_460);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
  pvVar3 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)(local_38 + 0x10),2)->super_vector<double,_std::allocator<double>_>;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,1);
  dVar1 = *pvVar4;
  paVar5 = &std::array<Disa::Vector_Dense<double,_3UL>,_3UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_3UL>,_3UL> *)local_170,2)->
            super_array<double,_3UL>;
  pvVar6 = std::array<double,_3UL>::operator[](paVar5,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_478,"-0.1 * dynamic_matrix[2][1]","static_matrix[2][1]",dVar1 * -0.1,
             *pvVar6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar2) {
    testing::Message::Message(&local_480);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_478);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x8c,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_480);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_480);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  pvVar3 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)(local_38 + 0x10),2)->super_vector<double,_std::allocator<double>_>;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,2);
  dVar1 = *pvVar4;
  paVar5 = &std::array<Disa::Vector_Dense<double,_3UL>,_3UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_3UL>,_3UL> *)local_170,2)->
            super_array<double,_3UL>;
  pvVar6 = std::array<double,_3UL>::operator[](paVar5,2);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_498,"-0.1 * dynamic_matrix[2][2]","static_matrix[2][2]",dVar1 * -0.1,
             *pvVar6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
  if (!bVar2) {
    testing::Message::Message(&local_4a0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_498);
    testing::internal::AssertHelper::AssertHelper
              (&local_4a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x8d,pcVar7);
    testing::internal::AssertHelper::operator=(&local_4a8,&local_4a0);
    testing::internal::AssertHelper::~AssertHelper(&local_4a8);
    testing::Message::~Message(&local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
  Disa::Matrix_Dense<double,_0UL,_0UL>::~Matrix_Dense
            ((Matrix_Dense<double,_0UL,_0UL> *)(local_38 + 0x10));
  return;
}

Assistant:

TEST(test_matrix_dense, scalar_matrix_multiplication_assignment) {
  Matrix_Dense<Scalar, 0, 0> dynamic_matrix = {{1, 2, 3}, {4, 5, 6}, {7, 8, 9}};
  Matrix_Dense<Scalar, 3, 3> static_matrix = {{10, 20, 30}, {40, 50, 60}, {70, 80, 90}};

  dynamic_matrix *= -10.0;
  EXPECT_DOUBLE_EQ(dynamic_matrix[0][0], -1.0 * static_matrix[0][0]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[0][1], -1.0 * static_matrix[0][1]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[0][2], -1.0 * static_matrix[0][2]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[1][0], -1.0 * static_matrix[1][0]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[1][1], -1.0 * static_matrix[1][1]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[1][2], -1.0 * static_matrix[1][2]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[2][0], -1.0 * static_matrix[2][0]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[2][1], -1.0 * static_matrix[2][1]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[2][2], -1.0 * static_matrix[2][2]);

  static_matrix *= 0.1;
  EXPECT_DOUBLE_EQ(-0.1 * dynamic_matrix[0][0], static_matrix[0][0]);
  EXPECT_DOUBLE_EQ(-0.1 * dynamic_matrix[0][1], static_matrix[0][1]);
  EXPECT_DOUBLE_EQ(-0.1 * dynamic_matrix[0][2], static_matrix[0][2]);
  EXPECT_DOUBLE_EQ(-0.1 * dynamic_matrix[1][0], static_matrix[1][0]);
  EXPECT_DOUBLE_EQ(-0.1 * dynamic_matrix[1][1], static_matrix[1][1]);
  EXPECT_DOUBLE_EQ(-0.1 * dynamic_matrix[1][2], static_matrix[1][2]);
  EXPECT_DOUBLE_EQ(-0.1 * dynamic_matrix[2][0], static_matrix[2][0]);
  EXPECT_DOUBLE_EQ(-0.1 * dynamic_matrix[2][1], static_matrix[2][1]);
  EXPECT_DOUBLE_EQ(-0.1 * dynamic_matrix[2][2], static_matrix[2][2]);
}